

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSphereShape.cpp
# Opt level: O3

void __thiscall chrono::ChSphereShape::ArchiveOUT(ChSphereShape *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::geometry::ChSphere> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChSphereShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gsphere;
  local_28._name = "gsphere";
  local_28._flags = '\0';
  ChArchiveOut::out<chrono::geometry::ChSphere>(marchive,&local_28);
  return;
}

Assistant:

void ChSphereShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSphereShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(gsphere);
}